

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

void binlog::nsSinceEpochToBrokenDownTimeUTC(nanoseconds sinceEpoch,BrokenDownTime *dst)

{
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> __t;
  rep rVar1;
  tm *in_RSI;
  nanoseconds remainder;
  __enable_if_is_duration<std::chrono::duration<long>_> seconds;
  time_t tt;
  time_point tp;
  duration<long,_std::ratio<1L,_1000000000L>_> in_stack_ffffffffffffffc8;
  time_t local_28;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  in_stack_ffffffffffffffe8;
  
  __t = std::chrono::
        duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                  (in_stack_ffffffffffffffc8.__r);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)&stack0xffffffffffffffe8,(duration *)&stack0xffffffffffffffe0);
  local_28 = std::chrono::_V2::system_clock::to_time_t((time_point *)__t.__r);
  gmtime_r(&local_28,in_RSI);
  std::chrono::
  duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
            ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffffc8.__r);
  std::chrono::operator-
            ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffffe8.__d.__r,
             (duration<long,_std::ratio<1L,_1L>_> *)__t.__r);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)&stack0xffffffffffffffc8);
  in_RSI[1].tm_sec = (int)rVar1;
  return;
}

Assistant:

void nsSinceEpochToBrokenDownTimeUTC(std::chrono::nanoseconds sinceEpoch, BrokenDownTime& dst)
{
  using clock = std::chrono::system_clock;

  // assumption: system_clock measures Unix Time
  // (i.e., time since 1970.01.01 00:00:00 UTC, not counting leap seconds).
  // Valid since C++20, tested by unit tests.
  const clock::time_point tp{std::chrono::duration_cast<clock::duration>(sinceEpoch)};
  const std::time_t tt = clock::to_time_t(tp);

  #ifdef _WIN32
    gmtime_s(&dst, &tt);
  #else // assume POSIX
    gmtime_r(&tt, &dst);
  #endif

  // set the sub-second part
  const auto seconds = std::chrono::duration_cast<std::chrono::seconds>(sinceEpoch);
  const std::chrono::nanoseconds remainder{sinceEpoch - seconds};

  dst.tm_nsec = int(remainder.count());
}